

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::arc
          (Fl_PostScript_Graphics_Driver *this,int x,int y,int w,int h,double a1,double a2)

{
  double a2_local;
  double a1_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  if ((1 < w) && (1 < h)) {
    fprintf((FILE *)this->output,"GS\n");
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x19])();
    clocale_printf(this,"%g %g TR\n",((double)x + (double)w / 2.0) - 0.5,
                   ((double)y + (double)h / 2.0) - 0.5);
    clocale_printf(this,"%g %g SC\n",(double)(w + -1) / 2.0,(double)(h + -1) / 2.0);
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x1f])
              (0,0,0x3ff0000000000000,a2,a1);
    clocale_printf(this,"%g %g SC\n",2.0 / (double)(w + -1),2.0 / (double)(h + -1));
    clocale_printf(this,"%g %g TR\n",((double)-x - (double)w / 2.0) + 0.5,
                   ((double)-y - (double)h / 2.0) + 0.5);
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x23])();
    fprintf((FILE *)this->output,"GR\n");
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::arc(int x, int y, int w, int h, double a1, double a2) {
  if (w <= 1 || h <= 1) return;
  fprintf(output, "GS\n");
  //fprintf(output, "BP\n");
  begin_line();
  clocale_printf("%g %g TR\n", x + w/2.0 -0.5 , y + h/2.0 - 0.5);
  clocale_printf("%g %g SC\n", (w-1)/2.0 , (h-1)/2.0 );
  arc(0,0,1,a2,a1);
  //  fprintf(output, "0 0 1 %g %g arc\n" , -a1 , -a2);
  clocale_printf("%g %g SC\n", 2.0/(w-1) , 2.0/(h-1) );
  clocale_printf("%g %g TR\n", -x - w/2.0 +0.5 , -y - h/2.0 +0.5);
  end_line();
  
  //  fprintf(output, "%g setlinewidth\n",  2/sqrt(w*h));
  //  fprintf(output, "ELP\n");
  //  fprintf(output, 2.0/w , 2.0/w , " SC\n";
  //  fprintf(output, (-x - w/2.0) , (-y - h/2)  , " TR\n";
  fprintf(output, "GR\n");
}